

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.cpp
# Opt level: O0

savebuf * __thiscall agr::savebuf::str_abi_cxx11_(savebuf *this)

{
  long in_RSI;
  savebuf *this_local;
  
  std::__cxx11::string::string((string *)this,(string *)(in_RSI + 0x48));
  return this;
}

Assistant:

std::string savebuf::str() const 
   { 
    return save; 
   }